

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O1

int __thiscall ncnn::Bias::forward_inplace(Bias *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  uint uVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    pvVar7 = bottom_top_blob->data;
    pvVar5 = (this->bias_data).data;
    lVar8 = 0;
    do {
      if (0 < (int)uVar6) {
        fVar1 = *(float *)((long)pvVar5 + lVar8 * 4);
        uVar9 = 0;
        do {
          *(float *)((long)pvVar7 + uVar9 * 4) = *(float *)((long)pvVar7 + uVar9 * 4) + fVar1;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      lVar8 = lVar8 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
    } while (lVar8 != iVar2);
  }
  return 0;
}

Assistant:

int Bias::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_data[q];

        for (int i = 0; i < size; i++)
        {
            ptr[i] += bias;
        }
    }

    return 0;
}